

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

InstanceBodySymbol *
slang::ast::InstanceBodySymbol::fromDefinition
          (Compilation *compilation,DefinitionSymbol *definition,SourceLocation instanceLoc,
          bitmask<slang::ast::InstanceFlags> flags,HierarchyOverrideNode *hierarchyOverrideNode,
          ConfigBlockSymbol *configBlock,ConfigRule *configRule)

{
  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> parameterDecls;
  InstanceBodySymbol *pIVar1;
  ParameterBuilder paramBuilder;
  undefined1 local_1c8 [320];
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  local_88;
  HierarchyOverrideNode *local_50;
  Scope *local_48;
  bool local_40;
  
  parameterDecls._M_ptr =
       (definition->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.
       data_;
  parameterDecls._M_extent._M_extent_value =
       (definition->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.
       len;
  ParameterBuilder::ParameterBuilder
            ((ParameterBuilder *)local_1c8,(definition->super_Symbol).parentScope,
             (definition->super_Symbol).name,parameterDecls);
  local_40 = (bool)(flags.m_bits & 1);
  if (hierarchyOverrideNode != (HierarchyOverrideNode *)0x0) {
    local_50 = hierarchyOverrideNode;
  }
  if ((configRule != (ConfigRule *)0x0) &&
     (configRule->paramOverrides != (ParameterValueAssignmentSyntax *)0x0)) {
    local_48 = &configBlock->super_Scope;
    ParameterBuilder::setAssignments((ParameterBuilder *)local_1c8,configRule->paramOverrides,true);
  }
  pIVar1 = fromDefinition(compilation,definition,instanceLoc,(ParameterBuilder *)local_1c8,flags);
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_((allocator_type)local_1c8._312_8_,&local_88);
  return pIVar1;
}

Assistant:

InstanceBodySymbol& InstanceBodySymbol::fromDefinition(
    Compilation& compilation, const DefinitionSymbol& definition, SourceLocation instanceLoc,
    bitmask<InstanceFlags> flags, const HierarchyOverrideNode* hierarchyOverrideNode,
    const ConfigBlockSymbol* configBlock, const ConfigRule* configRule) {

    ParameterBuilder paramBuilder(*definition.getParentScope(), definition.name,
                                  definition.parameters);
    paramBuilder.setForceInvalidValues(flags.has(InstanceFlags::Uninstantiated));
    if (hierarchyOverrideNode)
        paramBuilder.setOverrides(hierarchyOverrideNode);

    if (configRule && configRule->paramOverrides) {
        SLANG_ASSERT(configBlock);
        paramBuilder.setConfigScope(*configBlock);
        paramBuilder.setAssignments(*configRule->paramOverrides, /* isFromConfig */ true);
    }

    return fromDefinition(compilation, definition, instanceLoc, paramBuilder, flags);
}